

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::numparse::impl::StringSegment::toTempUnicodeString
          (UnicodeString *__return_storage_ptr__,StringSegment *this)

{
  char16_t *pcVar1;
  ConstChar16Ptr local_28 [3];
  
  pcVar1 = UnicodeString::getBuffer(&this->fStr);
  local_28[0].p_ = pcVar1 + this->fStart;
  UnicodeString::UnicodeString(__return_storage_ptr__,'\0',local_28,this->fEnd - this->fStart);
  return __return_storage_ptr__;
}

Assistant:

const UnicodeString StringSegment::toTempUnicodeString() const {
    // Use the readonly-aliasing constructor for efficiency.
    return UnicodeString(FALSE, fStr.getBuffer() + fStart, fEnd - fStart);
}